

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void CLI::detail::remove_default_flag_values(string *flags)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  undefined1 local_29;
  
  while( true ) {
    lVar2 = ::std::__cxx11::string::find((char)flags,0x7b);
    if (lVar2 == -1) break;
    lVar3 = ::std::__cxx11::string::find_first_of((char *)flags,0x138927);
    if ((lVar3 != -1) && (pcVar1 = (flags->_M_dataplus)._M_p, pcVar1[lVar3] == '}')) {
      ::std::__cxx11::string::erase(flags,pcVar1 + lVar2,pcVar1 + lVar3 + 1);
    }
  }
  _Var4._M_current = (flags->_M_dataplus)._M_p;
  local_29 = 0x21;
  _Var4 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var4,_Var4._M_current + flags->_M_string_length,
                     (_Iter_equals_val<const_char>)&local_29);
  ::std::__cxx11::string::erase
            (flags,_Var4._M_current,(flags->_M_dataplus)._M_p + flags->_M_string_length);
  return;
}

Assistant:

inline void remove_default_flag_values(std::string &flags) {
    auto loc = flags.find_first_of('{');
    while(loc != std::string::npos) {
        auto finish = flags.find_first_of("},", loc + 1);
        if((finish != std::string::npos) && (flags[finish] == '}')) {
            flags.erase(flags.begin() + static_cast<std::ptrdiff_t>(loc),
                        flags.begin() + static_cast<std::ptrdiff_t>(finish) + 1);
        }
        loc = flags.find_first_of('{', loc + 1);
    }
    flags.erase(std::remove(flags.begin(), flags.end(), '!'), flags.end());
}